

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotStemsEx<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>>
               (char *label_id,GetterXsYs<short> *get_mark,GetterXsYRef<short> *get_base)

{
  double dVar1;
  ImVec2 IVar2;
  undefined8 uVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar13;
  undefined1 auVar14 [16];
  ImPlotContext *pIVar15;
  GetterXsYs<short> *getter1;
  bool bVar16;
  ImU32 IVar17;
  ImU32 col_mk_fill;
  long lVar18;
  ImDrawList *DrawList;
  long lVar19;
  ImPlotContext *pIVar20;
  byte bVar21;
  byte bVar22;
  uint uVar23;
  short *psVar24;
  short *psVar25;
  ImPlotRange *pIVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  double dVar38;
  double dVar41;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  byte local_ac;
  undefined8 local_90;
  GetterXsYs<short> *local_88;
  long local_80;
  ulong local_78;
  double local_70;
  short *local_68;
  short *local_60;
  short *local_58;
  uint local_4c;
  short *local_48;
  undefined8 uStack_40;
  
  bVar16 = BeginItem(label_id,0);
  pIVar20 = GImPlot;
  if (bVar16) {
    if ((GImPlot->FitThisFrame == true) && (iVar6 = get_base->Count, 0 < iVar6)) {
      local_48 = get_mark->Xs;
      local_58 = get_mark->Ys;
      iVar27 = get_mark->Count;
      pIVar13 = GImPlot->CurrentPlot;
      iVar7 = pIVar13->CurrentYAxis;
      uVar8 = (pIVar13->XAxis).Flags;
      pIVar26 = GImPlot->ExtentsY + iVar7;
      uVar9 = pIVar13->YAxis[iVar7].Flags;
      dVar1 = get_base->YRef;
      local_70 = ABS(dVar1);
      bVar21 = dVar1 <= 0.0 & (byte)(uVar9 >> 5) & 7;
      bVar22 = 0x7fefffffffffffff < (ulong)local_70 | bVar21;
      local_78 = CONCAT71(local_78._1_7_,bVar22);
      uVar23 = (uVar9 & 0x20) >> 5;
      local_80 = CONCAT44(local_80._4_4_,uVar23);
      lVar28 = local_80;
      uVar10 = get_mark->Offset;
      local_60 = (short *)(ulong)uVar10;
      local_68 = (short *)(long)get_mark->Stride;
      psVar24 = get_base->Xs;
      iVar11 = get_base->Offset;
      iVar12 = get_base->Stride;
      iVar29 = 0;
      do {
        lVar18 = (long)(((int)(uVar10 + iVar29) % iVar27 + iVar27) % iVar27) * (long)local_68;
        sVar4 = *(short *)((long)local_48 + lVar18);
        dVar36 = (double)(int)sVar4;
        sVar5 = *(short *)((long)local_58 + lVar18);
        dVar35 = (double)(int)sVar5;
        if ((uVar8 >> 10 & 1) == 0) {
          if ((0 < sVar4) || ((uVar8 & 0x20) == 0)) {
LAB_0020b8ea:
            dVar38 = (pIVar20->ExtentsX).Min;
            dVar41 = (pIVar20->ExtentsX).Max;
            uVar30 = -(ulong)(dVar36 < dVar38);
            uVar31 = -(ulong)(dVar41 < dVar36);
            auVar42._0_8_ = (ulong)dVar36 & uVar30;
            auVar42._8_8_ = (ulong)dVar36 & uVar31;
            auVar45._0_8_ = ~uVar30 & (ulong)dVar38;
            auVar45._8_8_ = ~uVar31 & (ulong)dVar41;
            pIVar20->ExtentsX = (ImPlotRange)(auVar45 | auVar42);
          }
        }
        else if (((pIVar13->YAxis[iVar7].Range.Min <= dVar35) &&
                 (dVar35 <= pIVar13->YAxis[iVar7].Range.Max)) &&
                (local_ac = (byte)((uVar8 & 0x20) >> 5), (sVar4 < 1 & local_ac) == 0))
        goto LAB_0020b8ea;
        if ((uVar9 >> 10 & 1) == 0) {
          if ((0 < sVar5) || ((uVar9 & 0x20) == 0)) {
LAB_0020b958:
            dVar36 = pIVar20->ExtentsY[iVar7].Max;
            uVar30 = -(ulong)(dVar35 < pIVar26->Min);
            uVar31 = -(ulong)(dVar36 < dVar35);
            auVar37._0_8_ = (ulong)dVar35 & uVar30;
            auVar37._8_8_ = (ulong)dVar35 & uVar31;
            auVar43._0_8_ = ~uVar30 & (ulong)pIVar26->Min;
            auVar43._8_8_ = ~uVar31 & (ulong)dVar36;
            *pIVar26 = (ImPlotRange)(auVar43 | auVar37);
          }
        }
        else if ((((pIVar13->XAxis).Range.Min <= dVar36) && (dVar36 <= (pIVar13->XAxis).Range.Max))
                && (local_80._0_1_ = (byte)uVar23, (sVar5 < 1 & (byte)local_80) == 0))
        goto LAB_0020b958;
        sVar4 = *(short *)((long)psVar24 +
                          (long)(((iVar11 + iVar29) % iVar6 + iVar6) % iVar6) * (long)iVar12);
        dVar36 = (double)(int)sVar4;
        if ((uVar8 >> 10 & 1) == 0) {
          if (((uVar8 & 0x20) == 0) || (0 < sVar4)) {
LAB_0020b9e1:
            dVar35 = (pIVar20->ExtentsX).Min;
            dVar38 = (pIVar20->ExtentsX).Max;
            uVar30 = -(ulong)(dVar36 < dVar35);
            uVar31 = -(ulong)(dVar38 < dVar36);
            auVar39._0_8_ = (ulong)dVar36 & uVar30;
            auVar39._8_8_ = (ulong)dVar36 & uVar31;
            auVar44._0_8_ = ~uVar30 & (ulong)dVar35;
            auVar44._8_8_ = ~uVar31 & (ulong)dVar38;
            pIVar20->ExtentsX = (ImPlotRange)(auVar44 | auVar39);
          }
        }
        else if (((pIVar13->YAxis[iVar7].Range.Min <= dVar1) &&
                 (dVar1 <= pIVar13->YAxis[iVar7].Range.Max)) &&
                (((byte)uVar8 >> 5 & sVar4 < 1) == 0)) goto LAB_0020b9e1;
        if ((uVar9 >> 10 & 1) == 0) {
          if (bVar22 == 0) {
LAB_0020ba28:
            dVar36 = pIVar20->ExtentsY[iVar7].Max;
            uVar31 = -(ulong)(dVar1 < pIVar26->Min);
            uVar32 = -(ulong)(dVar36 < dVar1);
            uVar30 = (ulong)dVar1 & uVar32;
            auVar40._0_8_ = ~uVar31 & (ulong)pIVar26->Min;
            auVar40._8_8_ = ~uVar32 & (ulong)dVar36;
            auVar14._8_4_ = (int)uVar30;
            auVar14._0_8_ = (ulong)dVar1 & uVar31;
            auVar14._12_4_ = (int)(uVar30 >> 0x20);
            *pIVar26 = (ImPlotRange)(auVar40 | auVar14);
          }
        }
        else if (((ulong)local_70 < 0x7ff0000000000000 && bVar21 == 0) &&
                 (dVar36 <= (pIVar13->XAxis).Range.Max && (pIVar13->XAxis).Range.Min <= dVar36))
        goto LAB_0020ba28;
        iVar29 = iVar29 + 1;
        local_80 = lVar28;
      } while (iVar6 != iVar29);
    }
    local_88 = get_mark;
    DrawList = GetPlotDrawList();
    getter1 = local_88;
    if ((pIVar20->NextItemData).RenderLine == true) {
      IVar17 = ImGui::GetColorU32((pIVar20->NextItemData).Colors);
      iVar6 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar6]) {
      case 0:
        local_90 = CONCAT44(local_90._4_4_,iVar6);
        RenderLineSegments<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>,ImPlot::TransformerLinLin>
                  (getter1,get_base,(TransformerLinLin *)&local_90,DrawList,
                   (pIVar20->NextItemData).LineWeight,IVar17);
        break;
      case 1:
        local_90 = CONCAT44(local_90._4_4_,iVar6);
        RenderLineSegments<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>,ImPlot::TransformerLogLin>
                  (getter1,get_base,(TransformerLogLin *)&local_90,DrawList,
                   (pIVar20->NextItemData).LineWeight,IVar17);
        break;
      case 2:
        local_90 = CONCAT44(local_90._4_4_,iVar6);
        RenderLineSegments<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>,ImPlot::TransformerLinLog>
                  (getter1,get_base,(TransformerLinLog *)&local_90,DrawList,
                   (pIVar20->NextItemData).LineWeight,IVar17);
        break;
      case 3:
        local_90 = CONCAT44(local_90._4_4_,iVar6);
        RenderLineSegments<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>,ImPlot::TransformerLogLog>
                  (getter1,get_base,(TransformerLogLog *)&local_90,DrawList,
                   (pIVar20->NextItemData).LineWeight,IVar17);
      }
    }
    iVar6 = (pIVar20->NextItemData).Marker;
    iVar27 = 0;
    if (iVar6 != -1) {
      iVar27 = iVar6;
    }
    PopPlotClipRect();
    PushPlotClipRect((pIVar20->NextItemData).MarkerSize);
    IVar17 = ImGui::GetColorU32((pIVar20->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar20->NextItemData).Colors + 3);
    pIVar15 = GImPlot;
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    lVar28 = (long)transformer.YAxis;
    switch(GImPlot->Scales[lVar28]) {
    case 0:
      iVar6 = getter1->Count;
      if (0 < iVar6) {
        psVar24 = getter1->Xs;
        psVar25 = getter1->Ys;
        uVar30 = (ulong)(uint)getter1->Offset;
        local_58 = (short *)CONCAT44(local_58._4_4_,(pIVar20->NextItemData).MarkerSize);
        local_60 = (short *)CONCAT44(local_60._4_4_,(pIVar20->NextItemData).MarkerWeight);
        iVar7 = getter1->Stride;
        local_70 = (double)(long)iVar27;
        iVar27 = 0;
        lVar18 = lVar28 << 7;
        bVar16 = (pIVar20->NextItemData).RenderMarkerLine;
        local_88 = (GetterXsYs<short> *)
                   CONCAT44(local_88._4_4_,(uint)(pIVar20->NextItemData).RenderMarkerFill);
        pIVar20 = GImPlot;
        local_80 = lVar18;
        local_78 = uVar30;
        local_68 = psVar25;
        local_48 = psVar24;
        do {
          lVar19 = (long)((((int)uVar30 + iVar27) % iVar6 + iVar6) % iVar6) * (long)iVar7;
          IVar2 = pIVar20->PixelRange[lVar28].Min;
          fVar33 = (float)(pIVar20->Mx *
                           ((double)(int)*(short *)((long)psVar24 + lVar19) -
                           (pIVar20->CurrentPlot->XAxis).Range.Min) + (double)IVar2.x);
          fVar34 = (float)(pIVar20->My[lVar28] *
                           ((double)(int)((long)((ulong)*(ushort *)((long)psVar25 + lVar19) << 0x30)
                                         >> 0x30) -
                           *(double *)((long)&pIVar20->CurrentPlot->YAxis[0].Range.Min + lVar18)) +
                          (double)IVar2.y);
          local_90 = CONCAT44(fVar34,fVar33);
          pIVar13 = pIVar15->CurrentPlot;
          if ((((pIVar13->PlotRect).Min.x <= fVar33) &&
              (uVar3 = *(undefined8 *)&(pIVar13->PlotRect).Min.y, (float)uVar3 <= fVar34)) &&
             ((fVar33 < (float)((ulong)uVar3 >> 0x20) && (fVar34 < (pIVar13->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<short>>(ImPlot::GetterXsYs<short>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_70 * 8))
                      (DrawList,&local_90,bVar16,IVar17,(ulong)local_88 & 0xffffffff,col_mk_fill);
            pIVar20 = GImPlot;
            psVar24 = local_48;
            psVar25 = local_68;
            uVar30 = local_78;
            lVar18 = local_80;
          }
          iVar27 = iVar27 + 1;
        } while (iVar6 != iVar27);
      }
      break;
    case 1:
      iVar6 = getter1->Count;
      if (0 < iVar6) {
        local_58 = getter1->Xs;
        local_60 = getter1->Ys;
        local_68 = (short *)(ulong)(uint)getter1->Offset;
        local_80 = CONCAT44(local_80._4_4_,(pIVar20->NextItemData).MarkerSize);
        local_70 = (double)(long)getter1->Stride;
        local_88 = (GetterXsYs<short> *)(long)iVar27;
        iVar27 = 0;
        local_78 = lVar28 << 4;
        bVar16 = (pIVar20->NextItemData).RenderMarkerLine;
        local_4c = (uint)(pIVar20->NextItemData).RenderMarkerFill;
        do {
          pIVar20 = GImPlot;
          lVar18 = (long)((((int)local_68 + iVar27) % iVar6 + iVar6) % iVar6) * (long)local_70;
          local_48 = (short *)(double)(int)*(short *)((long)local_60 + lVar18);
          uStack_40 = 0;
          dVar36 = log10((double)(int)*(short *)((long)local_58 + lVar18) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar13 = pIVar20->CurrentPlot;
          dVar1 = (pIVar13->XAxis).Range.Min;
          uVar3 = *(undefined8 *)((long)&pIVar20->PixelRange[0].Min.x + local_78);
          fVar33 = (float)(pIVar20->Mx *
                           (((double)(float)(dVar36 / pIVar20->LogDenX) *
                             ((pIVar13->XAxis).Range.Max - dVar1) + dVar1) - dVar1) +
                          (double)(float)uVar3);
          fVar34 = (float)(pIVar20->My[lVar28] *
                           ((double)local_48 - pIVar13->YAxis[lVar28].Range.Min) +
                          (double)(float)((ulong)uVar3 >> 0x20));
          local_90 = CONCAT44(fVar34,fVar33);
          pIVar13 = pIVar15->CurrentPlot;
          if (((((pIVar13->PlotRect).Min.x <= fVar33) && ((pIVar13->PlotRect).Min.y <= fVar34)) &&
              (fVar33 < (pIVar13->PlotRect).Max.x)) && (fVar34 < (pIVar13->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<short>>(ImPlot::GetterXsYs<short>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_88 * 8))
                      (DrawList,&local_90,bVar16,IVar17,local_4c,col_mk_fill);
          }
          iVar27 = iVar27 + 1;
        } while (iVar6 != iVar27);
      }
      break;
    case 2:
      iVar6 = getter1->Count;
      if (0 < iVar6) {
        local_58 = getter1->Xs;
        local_60 = getter1->Ys;
        local_68 = (short *)(ulong)(uint)getter1->Offset;
        local_80 = CONCAT44(local_80._4_4_,(pIVar20->NextItemData).MarkerSize);
        local_70 = (double)(long)getter1->Stride;
        local_88 = (GetterXsYs<short> *)(long)iVar27;
        iVar27 = 0;
        local_78 = lVar28 << 4;
        bVar16 = (pIVar20->NextItemData).RenderMarkerLine;
        local_4c = (uint)(pIVar20->NextItemData).RenderMarkerFill;
        do {
          pIVar20 = GImPlot;
          lVar18 = (long)((((int)local_68 + iVar27) % iVar6 + iVar6) % iVar6) * (long)local_70;
          local_48 = (short *)(double)(int)*(short *)((long)local_58 + lVar18);
          uStack_40 = 0;
          dVar36 = log10((double)(int)*(short *)((long)local_60 + lVar18) /
                         GImPlot->CurrentPlot->YAxis[lVar28].Range.Min);
          pIVar13 = pIVar20->CurrentPlot;
          dVar1 = pIVar13->YAxis[lVar28].Range.Min;
          uVar3 = *(undefined8 *)((long)&pIVar20->PixelRange[0].Min.x + local_78);
          fVar33 = (float)(pIVar20->Mx * ((double)local_48 - (pIVar13->XAxis).Range.Min) +
                          (double)(float)uVar3);
          fVar34 = (float)(pIVar20->My[lVar28] *
                           (((double)(float)(dVar36 / pIVar20->LogDenY[lVar28]) *
                             (pIVar13->YAxis[lVar28].Range.Max - dVar1) + dVar1) - dVar1) +
                          (double)(float)((ulong)uVar3 >> 0x20));
          local_90 = CONCAT44(fVar34,fVar33);
          pIVar13 = pIVar15->CurrentPlot;
          if ((((pIVar13->PlotRect).Min.x <= fVar33) && ((pIVar13->PlotRect).Min.y <= fVar34)) &&
             ((fVar33 < (pIVar13->PlotRect).Max.x && (fVar34 < (pIVar13->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<short>>(ImPlot::GetterXsYs<short>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_88 * 8))
                      (DrawList,&local_90,bVar16,IVar17,local_4c,col_mk_fill);
          }
          iVar27 = iVar27 + 1;
        } while (iVar6 != iVar27);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<short>>
                (*getter1,transformer,DrawList,iVar27,(pIVar20->NextItemData).MarkerSize,
                 (pIVar20->NextItemData).RenderMarkerLine,IVar17,
                 (pIVar20->NextItemData).MarkerWeight,(pIVar20->NextItemData).RenderMarkerFill,
                 col_mk_fill);
    }
    pIVar20 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar20->NextItemData);
    pIVar20->PreviousItem = pIVar20->CurrentItem;
    pIVar20->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}